

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  rle16_t *prVar5;
  uint16_t *puVar6;
  int32_t iVar7;
  uint uVar8;
  long lVar9;
  array_container_t *paVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  byte bVar15;
  uint uVar16;
  uint8_t uVar17;
  int iVar18;
  
  iVar4 = c->n_runs;
  uVar8 = croaring_hardware_support();
  if ((uVar8 & 2) == 0) {
    uVar8 = croaring_hardware_support();
    if ((uVar8 & 1) == 0) {
      iVar18 = c->n_runs;
      lVar9 = (long)iVar18;
      if (0 < lVar9) {
        lVar13 = 0;
        do {
          iVar18 = iVar18 + (uint)c->runs[lVar13].length;
          lVar13 = lVar13 + 1;
        } while (lVar9 != lVar13);
      }
    }
    else {
      iVar18 = _avx2_run_container_cardinality(c);
    }
  }
  else {
    iVar18 = _avx512_run_container_cardinality(c);
  }
  iVar14 = 0x1ffe;
  if (iVar18 * 2 < 0x1ffe) {
    iVar14 = iVar18 * 2;
  }
  uVar17 = '\x03';
  paVar10 = (array_container_t *)c;
  if (iVar14 < iVar4 * 4) {
    if (iVar18 < 0x1001) {
      paVar10 = array_container_create_given_capacity(iVar18);
      paVar10->cardinality = 0;
      iVar4 = c->n_runs;
      uVar17 = '\x02';
      if (0 < (long)iVar4) {
        prVar5 = c->runs;
        puVar6 = paVar10->array;
        lVar9 = 0;
        iVar7 = paVar10->cardinality;
        do {
          iVar18 = iVar7;
          uVar1 = prVar5[lVar9].value;
          uVar2 = prVar5[lVar9].length;
          lVar13 = 0;
          do {
            puVar6[iVar18 + lVar13] = uVar1 + (short)lVar13;
            lVar13 = lVar13 + 1;
            iVar14 = (int)lVar13;
          } while (uVar2 + 1 != iVar14);
          lVar9 = lVar9 + 1;
          iVar7 = iVar18 + iVar14;
        } while (lVar9 != iVar4);
        paVar10->cardinality = iVar18 + iVar14;
      }
    }
    else {
      paVar10 = (array_container_t *)bitset_container_create();
      iVar4 = c->n_runs;
      if (0 < (long)iVar4) {
        prVar5 = c->runs;
        puVar6 = paVar10->array;
        lVar9 = 0;
        do {
          uVar2 = prVar5[lVar9].value;
          uVar3 = prVar5[lVar9].length;
          if ((uint)uVar3 + (uint)uVar2 + 1 != (uint)uVar2) {
            uVar16 = (uint)uVar3 + (uint)uVar2;
            uVar12 = (uint)(uVar2 >> 6);
            uVar11 = -1L << ((byte)uVar2 & 0x3f);
            uVar8 = uVar16 >> 6;
            bVar15 = (byte)uVar16;
            if (uVar8 - uVar12 == 0) {
              bVar15 = ~bVar15;
              uVar11 = (uVar11 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f);
              uVar8 = uVar12;
            }
            else {
              *(ulong *)(puVar6 + (ulong)uVar12 * 4) =
                   *(ulong *)(puVar6 + (ulong)uVar12 * 4) | uVar11;
              if (uVar12 + 1 < uVar8) {
                memset(puVar6 + (ulong)(uVar2 >> 6) * 4 + 4,0xff,
                       (ulong)((uVar8 - uVar12) - 2) * 8 + 8);
              }
              uVar11 = 0xffffffffffffffff >> (~bVar15 & 0x3f);
            }
            *(ulong *)(puVar6 + (ulong)uVar8 * 4) = *(ulong *)(puVar6 + (ulong)uVar8 * 4) | uVar11;
          }
          lVar9 = lVar9 + 1;
        } while (iVar4 != lVar9);
      }
      paVar10->cardinality = iVar18;
      uVar17 = '\x01';
    }
  }
  *typecode_after = uVar17;
  return paVar10;
}

Assistant:

container_t *convert_run_to_efficient_container(run_container_t *c,
                                                uint8_t *typecode_after) {
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}